

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O3

ChannelList *
anon_unknown.dwarf_1b6bd5::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  Channel *pCVar1;
  Slice *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  _Rb_tree_header *p_Var11;
  PixelType PVar12;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar13;
  Vec2 *pVVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  int local_a8;
  int iStack_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  Channel local_68 [56];
  
  puVar7 = (undefined8 *)Imf_3_2::Header::dataWindow();
  uVar3 = *puVar7;
  uVar4 = puVar7[1];
  lVar15 = -1;
  lVar19 = 4;
  do {
    lVar19 = lVar19 + -4;
    lVar8 = lVar15 + 1;
    lVar15 = lVar15 + 1;
  } while (channels[lVar8] != (char *)0x0);
  local_78 = uVar3;
  uStack_70 = uVar4;
  lVar8 = Imf_3_2::Header::dataWindow();
  iVar6 = *(int *)(lVar8 + 8);
  piVar9 = (int *)Imf_3_2::Header::dataWindow();
  lVar18 = (long)((iVar6 - *piVar9) + 1);
  lVar8 = Imf_3_2::Header::dataWindow();
  iVar6 = *(int *)(lVar8 + 0xc);
  lVar8 = Imf_3_2::Header::dataWindow();
  lVar16 = (long)((iVar6 - *(int *)(lVar8 + 4)) + 1);
  lVar8 = lVar15 * lVar18 * lVar16;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar8 * 4);
  if (lVar8 != 0) {
    pcVar13 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar8 = 0;
    lVar17 = 0;
LAB_00175c1b:
    do {
      uVar5 = random_int(0xffff);
      if ((~uVar5 & 0x7c00) == 0) {
        if ((uVar5 & 0x3ff) != 0) goto LAB_00175c1b;
      }
      if ((pt == (PixelType *)0x0) || (pt[lVar8] == HALF)) {
        *(short *)pcVar13 = (short)uVar5;
      }
      else {
        *(undefined4 *)pcVar13 =
             *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar5 & 0xffff) * 4);
      }
      lVar10 = lVar15 - lVar8;
      lVar8 = lVar8 + 1;
      pcVar13 = pcVar13 + 4;
      if (lVar10 == 1) {
        lVar8 = 0;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar18 * lVar16 * lVar15);
  }
  p_Var11 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var11->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var11->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (lVar15 != 0) {
    local_a8 = (int)uVar3;
    iStack_a0 = (int)uVar4;
    iVar6 = (iStack_a0 - local_a8) + 1;
    puVar7 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar7 = &(anonymous_namespace)::writingBuffer;
    }
    pVVar14 = (Vec2 *)*puVar7;
    lVar8 = 0;
    do {
      PVar12 = HALF;
      if (pt != (PixelType *)0x0) {
        PVar12 = pt[lVar8];
      }
      pCVar1 = (Channel *)channels[lVar8];
      Imf_3_2::Channel::Channel(local_68,PVar12,1,1,false);
      Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,pCVar1);
      pSVar2 = (Slice *)channels[lVar8];
      auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar20._0_8_ = lVar8;
      auVar20._12_4_ = 0x45300000;
      Imf_3_2::Slice::Make
                ((PixelType)local_68,(void *)(ulong)PVar12,pVVar14,(long)&local_78,(long)iVar6,1,
                 -lVar19,(int)-lVar19 * iVar6,1,
                 (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 100.0,true,false);
      p_Var11 = (_Rb_tree_header *)Imf_3_2::FrameBuffer::insert((char *)buf,pSVar2);
      pVVar14 = pVVar14 + 4;
      lVar8 = lVar8 + 1;
    } while (lVar15 != lVar8);
  }
  return (ChannelList *)p_Var11;
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt,
    FrameBuffer&       buf,    // buffer to fill with pointers to channel
    bool               writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    size_t activechans = 0;

    while (channels[activechans] != NULL)
    {
        activechans++;
    }

    size_t samples =
        size_t (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
        size_t (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
        activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size = samples * 4;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels - don't write NaN values
    size_t chan = 0;
    for (size_t i = 0; i < samples; i++)
    {

        half v;
        do
        {
            unsigned short int values =
                random_int (std::numeric_limits<unsigned short>::max ());
            v.setBits (values);
        } while (v.isNan ());

        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
        }
        else
        {
            *(float*) write_ptr = float (v);
        }
        chan++;
        write_ptr += 4;
        if (chan == activechans) { chan = 0; }
    }

    ChannelList chanlist;

    int64_t width         = (dw.max.x + 1 - dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;

    const char* offset =
        (writing ? writingBuffer.data () : readingBuffer.data ());
    for (size_t i = 0; i < activechans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];

        chanlist.insert (channels[i], type);
        buf.insert (
            channels[i],
            Slice::Make (
                type,
                offset,
                dw.min,
                width,
                1,
                activechans * 4,
                bytes_per_row,
                1,
                1,
                100. + i,
                false,
                false));
        offset += 4;
    }

    return chanlist;
}